

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

void __thiscall
ImageTexture::ImageTexture(ImageTexture *this,uchar *data,uint width,uint height,uint type)

{
  uint uVar1;
  ulong uVar2;
  Block *pBVar3;
  GpuCtx *pGVar4;
  ulong uVar5;
  undefined8 uVar6;
  ExplicitProducer *pEVar7;
  ExplicitProducer *extraout_RAX;
  GpuCtxWrapper *pGVar8;
  ExplicitProducer *extraout_RAX_00;
  ExplicitProducer *extraout_RAX_01;
  ExplicitProducer *extraout_RAX_02;
  ExplicitProducer *pEVar9;
  uint uVar10;
  ulong uVar11;
  
  pEVar7 = tracy::GetToken();
  uVar2 = (pEVar7->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  pEVar9 = pEVar7;
  if ((uVar2 & 0xffff) == 0) {
    tracy::moodycamel::
    ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar7,uVar2);
    pEVar9 = extraout_RAX;
  }
  pBVar3 = (pEVar7->super_ProducerBase).tailBlock;
  uVar11 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
  (pBVar3->field_0).elements[uVar11] = '\x0f';
  uVar5 = rdtsc();
  *(ulong *)((long)&pBVar3->field_0 + uVar11 + 1) =
       (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar9 >> 0x20),(int)uVar5);
  *(SourceLocationData **)((long)&pBVar3->field_0 + uVar11 + 9) =
       &ImageTexture::__tracy_source_location59;
  (pEVar7->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
  pGVar8 = tracy::GetGpuCtx();
  pGVar4 = pGVar8->ptr;
  uVar1 = pGVar4->m_head;
  uVar10 = uVar1 + 1 & 0xffff;
  pGVar4->m_head = uVar10;
  uVar6 = gl3wProcs.ptr[0x1b1];
  if (uVar10 != pGVar4->m_tail) {
    pGVar8 = tracy::GetGpuCtx();
    (*(code *)uVar6)((ulong)pGVar8->ptr->m_query[uVar1],0x8e28);
    pEVar7 = tracy::GetToken();
    uVar2 = (pEVar7->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
    pEVar9 = pEVar7;
    if ((uVar2 & 0xffff) == 0) {
      tracy::moodycamel::
      ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
      ExplicitProducer::enqueue_begin_alloc(pEVar7,uVar2);
      pEVar9 = extraout_RAX_00;
    }
    pBVar3 = (pEVar7->super_ProducerBase).tailBlock;
    uVar11 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
    (pBVar3->field_0).elements[uVar11] = '!';
    uVar5 = rdtsc();
    *(ulong *)((long)&pBVar3->field_0 + uVar11 + 1) =
         (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar9 >> 0x20),(int)uVar5);
    *(undefined4 *)((long)&pBVar3->field_0 + uVar11 + 9) = 0;
    *(short *)((long)&pBVar3->field_0 + uVar11 + 0xd) = (short)uVar1;
    pGVar8 = tracy::GetGpuCtx();
    (pBVar3->field_0).elements[uVar11 + 0xf] = pGVar8->ptr->m_context;
    *(SourceLocationData **)((long)&pBVar3->field_0 + uVar11 + 0x10) =
         &ImageTexture::__tracy_gpu_source_location60;
    (pEVar7->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
    this->m_width = width;
    this->m_height = height;
    this->m_channels = 4;
    (*gl3wProcs.ptr[0xb1])(1,this);
    (*gl3wProcs.ptr[0x16])(0xde1,(ulong)this->m_id);
    (*gl3wProcs.ptr[0x1da])(0xde1,0x2801,0x2703);
    (*gl3wProcs.ptr[0x1da])(0xde1,0x2800,0x2601);
    (*gl3wProcs.ptr[0x1da])(0xde1,0x2802,0x2901);
    (*gl3wProcs.ptr[0x1da])(0xde1,0x2803,0x2901);
    (*gl3wProcs.ptr[0x1d2])
              (0xde1,0,(ulong)type,(ulong)this->m_width,(ulong)this->m_height,0,0x1908,0x1401,data);
    (*gl3wProcs.ptr[0xb4])(0xde1);
    (*gl3wProcs.ptr[0x16])(0xde1,0);
    pGVar8 = tracy::GetGpuCtx();
    pGVar4 = pGVar8->ptr;
    uVar1 = pGVar4->m_head;
    uVar10 = uVar1 + 1 & 0xffff;
    pGVar4->m_head = uVar10;
    uVar6 = gl3wProcs.ptr[0x1b1];
    if (uVar10 != pGVar4->m_tail) {
      pGVar8 = tracy::GetGpuCtx();
      (*(code *)uVar6)((ulong)pGVar8->ptr->m_query[uVar1],0x8e28);
      pEVar7 = tracy::GetToken();
      uVar2 = (pEVar7->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
      pEVar9 = pEVar7;
      if ((uVar2 & 0xffff) == 0) {
        tracy::moodycamel::
        ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
        ExplicitProducer::enqueue_begin_alloc(pEVar7,uVar2);
        pEVar9 = extraout_RAX_01;
      }
      pBVar3 = (pEVar7->super_ProducerBase).tailBlock;
      uVar11 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
      (pBVar3->field_0).elements[uVar11] = '%';
      uVar5 = rdtsc();
      *(ulong *)((long)&pBVar3->field_0 + uVar11 + 1) =
           (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar9 >> 0x20),(int)uVar5);
      *(undefined4 *)((long)&pBVar3->field_0 + uVar11 + 9) = 0;
      *(short *)((long)&pBVar3->field_0 + uVar11 + 0xd) = (short)uVar1;
      pGVar8 = tracy::GetGpuCtx();
      (pBVar3->field_0).elements[uVar11 + 0xf] = pGVar8->ptr->m_context;
      (pEVar7->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
      pEVar7 = tracy::GetToken();
      uVar2 = (pEVar7->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
      pEVar9 = pEVar7;
      if ((uVar2 & 0xffff) == 0) {
        tracy::moodycamel::
        ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
        ExplicitProducer::enqueue_begin_alloc(pEVar7,uVar2);
        pEVar9 = extraout_RAX_02;
      }
      pBVar3 = (pEVar7->super_ProducerBase).tailBlock;
      uVar11 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
      (pBVar3->field_0).elements[uVar11] = '\x11';
      uVar5 = rdtsc();
      *(ulong *)((long)&pBVar3->field_0 + uVar11 + 1) =
           (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar9 >> 0x20),(int)uVar5);
      (pEVar7->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
      return;
    }
  }
  __assert_fail("m_head != m_tail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/TracyOpenGL.hpp"
                ,0xb4,"unsigned int tracy::GpuCtx::NextQueryId()");
}

Assistant:

ImageTexture::ImageTexture(unsigned char* data, unsigned int width, unsigned int height, unsigned int type)
{
    ZoneScoped;
    TracyGpuZone("ImageTexture::ImageTexture");
    m_width = width;
    m_height = height;
    m_channels = 4;
    glGenTextures(1, &m_id);
    glBindTexture(GL_TEXTURE_2D, m_id);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
	glTexImage2D(GL_TEXTURE_2D, 0, type, m_width, m_height, 0, GL_RGBA, GL_UNSIGNED_BYTE, data);
    glGenerateMipmap(GL_TEXTURE_2D);
    glBindTexture(GL_TEXTURE_2D, 0);
}